

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InsertSort.c
# Opt level: O2

int main(void)

{
  long lVar1;
  int sort [10];
  
  sort[4] = 7;
  sort[5] = 2;
  sort[6] = 6;
  sort[7] = 4;
  sort[0] = 3;
  sort[1] = 5;
  sort[2] = 1;
  sort[3] = 8;
  sort[8] = 9;
  sort[9] = 0;
  InsertSort(sort,10);
  for (lVar1 = 0; lVar1 != 10; lVar1 = lVar1 + 1) {
    printf("%d",(ulong)(uint)sort[lVar1]);
  }
  return 0;
}

Assistant:

int main(){
    int i,sort[10] = {3,5,1,8,7,2,6,4,9,0};
    InsertSort(sort,10);
    for (i = 0; i < 10; ++i) {
        printf("%d",sort[i]);
    }
    return 0;
}